

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4e1137::Handlers::beginEncrypt(Handlers *this,JSON *j)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Config CVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 extraout_RAX;
  char *pcVar3;
  bool owner_password_seen;
  bool user_password_seen;
  int key_len;
  string owner_password;
  string user_password;
  char local_ae;
  char local_ad;
  int local_ac;
  Config local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  QPDFJob local_98;
  _Any_data local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *peStack_70;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [32];
  element_type local_30 [2];
  
  local_ac = 0;
  local_50._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30[0].config._0_1_ = 0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50[0] = 0;
  local_ad = '\0';
  local_ae = '\0';
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_70 = (element_type *)0x0;
  local_60 = (element_type *)local_50;
  local_50._16_8_ = local_30;
  local_88._M_unused._M_object = operator_new(0x30);
  *(int **)local_88._M_unused._0_8_ = &local_ac;
  *(Handlers **)((long)local_88._M_unused._0_8_ + 8) = this;
  *(char **)((long)local_88._M_unused._0_8_ + 0x10) = &local_ad;
  *(undefined1 **)((long)local_88._M_unused._0_8_ + 0x18) = local_50 + 0x10;
  *(char **)((long)local_88._M_unused._0_8_ + 0x20) = &local_ae;
  *(element_type ***)((long)local_88._M_unused._0_8_ + 0x28) = &local_60;
  peStack_70 = (element_type *)
               std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:283:23)>
               ::_M_invoke;
  local_78._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:283:23)>
       ::_M_manager;
  JSON::forEachDictItem
            (j,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                *)&local_88);
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_78._M_pi)(&local_88,&local_88,3);
  }
  if (local_ac != 0) {
    if ((local_ad == '\x01') && (local_ae != '\0')) {
      QPDFJob::Config::encrypt
                (&local_a8,
                 (char *)(this->c_main).
                         super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 local_ac);
      p_Var2 = p_Stack_a0;
      CVar1.o = local_a8.o;
      local_a8.o = (QPDFJob *)0x0;
      p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CVar1.o;
      (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
      }
      if (local_60 != (element_type *)local_50) {
        operator_delete(local_60,CONCAT71(local_50._1_7_,local_50[0]) + 1);
      }
      if ((element_type *)local_50._16_8_ != local_30) {
        operator_delete((void *)local_50._16_8_,
                        CONCAT71(local_30[0].config._1_7_,local_30[0].config._0_1_) + 1);
      }
      return;
    }
    local_a8.o = &local_98;
    pcVar3 = 
    "the user and owner password are both required; use the empty string for the user password if you don\'t want a password"
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "the user and owner password are both required; use the empty string for the user password if you don\'t want a password"
               ,"");
    usage((Handlers *)&local_a8,(string *)pcVar3);
  }
  pcVar3 = 
  "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be supplied for one of them to set the key length without imposing any restrictions"
  ;
  local_a8.o = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be supplied for one of them to set the key length without imposing any restrictions"
             ,"");
  usage((Handlers *)&local_a8,(string *)pcVar3);
  if (local_a8.o != &local_98) {
    operator_delete(local_a8.o,
                    (ulong)((long)&((local_98.m.
                                     super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->log).
                                   super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           + 1));
  }
  if (local_60 != (element_type *)local_50) {
    operator_delete(local_60,CONCAT71(local_50._1_7_,local_50[0]) + 1);
  }
  if ((element_type *)local_50._16_8_ != local_30) {
    operator_delete((void *)local_50._16_8_,
                    CONCAT71(local_30[0].config._1_7_,local_30[0].config._0_1_) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
Handlers::beginEncrypt(JSON j)
{
    // This method is only called if the overall JSON structure matches the schema, so we already
    // know that keys that are present have the right types.
    int key_len = 0;
    std::string user_password;
    std::string owner_password;
    bool user_password_seen = false;
    bool owner_password_seen = false;
    j.forEachDictItem([&](std::string const& key, JSON value) {
        if ((key == "40bit") || (key == "128bit") || (key == "256bit")) {
            if (key_len != 0) {
                QTC::TC("qpdf", "QPDFJob json encrypt duplicate key length");
                usage("exactly one of 40bit, 128bit, or 256bit must be given");
            }
            key_len = QUtil::string_to_int(key.c_str());
        } else if (key == "userPassword") {
            user_password_seen = value.getString(user_password);
        } else if (key == "ownerPassword") {
            owner_password_seen = value.getString(owner_password);
        }
    });
    if (key_len == 0) {
        QTC::TC("qpdf", "QPDFJob json encrypt no key length");
        usage(
            "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be "
            "supplied for one of them to set the key length without imposing any restrictions");
    }
    if (!(user_password_seen && owner_password_seen)) {
        QTC::TC("qpdf", "QPDFJob json encrypt missing password");
        usage(
            "the user and owner password are both required; use the empty string for the user "
            "password if you don't want a password");
    }
    this->c_enc = c_main->encrypt(key_len, user_password, owner_password);
}